

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O2

basic_message<char> * __thiscall
booster::locale::basic_message<char>::operator=
          (basic_message<char> *this,basic_message<char> *other)

{
  basic_message<char> tmp;
  basic_message<char> local_90;
  
  if (this != other) {
    basic_message(&local_90,other);
    swap(this,&local_90);
    ~basic_message(&local_90);
  }
  return this;
}

Assistant:

basic_message const &operator=(basic_message const &other)
            {
                if(this==&other) {
                    return *this;
                }
                basic_message tmp(other);
                swap(tmp);
                return *this;
            }